

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::
createApply<deqp::gls::BuiltinPrecisionTests::Signature<float,float,float,float,deqp::gls::BuiltinPrecisionTests::Void>>
          (BuiltinPrecisionTests *this,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func,ExprP<float> *arg0,ExprP<float> *arg1,ExprP<float> *arg2,
          ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  Expr<float> *ptr;
  ExprP<float> EVar1;
  
  ptr = (Expr<float> *)operator_new(0x50);
  (ptr->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__Apply_00d1c578;
  ptr[1].super_ExprBase._vptr_ExprBase = (_func_int **)func;
  Tuple4<deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Tuple4((Tuple4<deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>_>
            *)(ptr + 2),arg0,arg1,arg2,arg3);
  EVar1 = exprP<float>(this,ptr);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}